

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2centroids.cc
# Opt level: O0

S2Point * S2::TrueCentroid(S2Point *__return_storage_ptr__,S2Point *a,S2Point *b)

{
  double local_60;
  double local_58;
  double cos2;
  double sin2;
  S2Point vsum;
  S2Point vdiff;
  S2Point *b_local;
  S2Point *a_local;
  
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)(vsum.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)a,b);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            ((D *)&sin2,(BasicVector<Vector3,_double,_3UL> *)a,b);
  cos2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                   ((BasicVector<Vector3,_double,_3UL> *)(vsum.c_ + 2));
  local_58 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                       ((BasicVector<Vector3,_double,_3UL> *)&sin2);
  if ((local_58 != 0.0) || (NAN(local_58))) {
    local_60 = sqrt(cos2 / local_58);
    util::math::internal_vector::operator*
              (__return_storage_ptr__,&local_60,(BasicVector<Vector3,_double,_3UL> *)&sin2);
  }
  else {
    Vector3<double>::Vector3(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point TrueCentroid(const S2Point& a, const S2Point& b) {
  // The centroid (multiplied by length) is a vector toward the midpoint
  // of the edge, whose length is twice the sine of half the angle between
  // the two vertices.  Defining theta to be this angle, we have:
  S2Point vdiff = a - b;  // Length == 2*sin(theta)
  S2Point vsum = a + b;   // Length == 2*cos(theta)
  double sin2 = vdiff.Norm2();
  double cos2 = vsum.Norm2();
  if (cos2 == 0) return S2Point();  // Ignore antipodal edges.
  return sqrt(sin2 / cos2) * vsum;  // Length == 2*sin(theta)
}